

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O1

int value_from_text(char *text,value_t *value,char type)

{
  int iVar1;
  undefined8 in_RAX;
  char *pcVar2;
  size_t __size;
  uchar *__dest;
  undefined7 in_register_00000011;
  int stmp;
  uint utmp;
  undefined8 local_28;
  
  iVar1 = (int)CONCAT71(in_register_00000011,type);
  value->type = iVar1;
  if (iVar1 < 0x62) {
    if (iVar1 == 0x43) {
      iVar1 = __isoc99_sscanf(text,"#%02hhx%02hhx%02hhx%02hhx",&value->val,
                              (undefined1 *)((long)&value->val + 1),
                              (undefined1 *)((long)&value->val + 2),
                              (undefined1 *)((long)&value->val + 3));
      if (iVar1 == 4) {
        return 1;
      }
      goto LAB_001057e1;
    }
    if (iVar1 == 0x53) {
      pcVar2 = "%d";
    }
    else {
      if (iVar1 != 0x55) goto switchD_0010563d_caseD_65;
      pcVar2 = "%u";
    }
    goto LAB_00105795;
  }
  local_28 = in_RAX;
  if (0x72 < iVar1) {
    if (iVar1 == 0x73) {
      iVar1 = __isoc99_sscanf(text,"%d",&local_28);
      if (iVar1 == 1) {
        local_28._4_2_ = (uint16_t)local_28;
LAB_0010577e:
        (value->val).u = local_28._4_2_;
        return 1;
      }
    }
    else {
      if (iVar1 != 0x75) {
        if (iVar1 == 0x7a) {
          pcVar2 = strdup(text);
          (value->val).z = pcVar2;
          return 1;
        }
        goto switchD_0010563d_caseD_65;
      }
      iVar1 = __isoc99_sscanf(text,"%u",(long)&local_28 + 4);
      if (iVar1 == 1) {
        goto LAB_0010577e;
      }
    }
LAB_0010580d:
    fprintf(_stderr,"%s:value_from_text: couldn\'t parse \'%c\' from  \"%s\"\n",argv0,
            (ulong)(uint)value->type,text);
    return 0;
  }
  switch(iVar1) {
  case 0x62:
    iVar1 = __isoc99_sscanf(text,"%u",(long)&local_28 + 4);
    if (iVar1 != 1) goto LAB_0010580d;
    local_28._0_1_ = local_28._4_1_;
    goto LAB_00105702;
  case 99:
    iVar1 = __isoc99_sscanf(text,"%d",&local_28);
    if (iVar1 != 1) goto LAB_0010580d;
LAB_00105702:
    (value->val).b = (uchar)local_28;
    return 1;
  case 100:
    pcVar2 = "%lf";
    break;
  default:
switchD_0010563d_caseD_65:
    value_from_text_cold_1();
    return 0;
  case 0x66:
    pcVar2 = "%f";
    break;
  case 0x6d:
    __size = strlen(text);
    __dest = (uchar *)malloc(__size);
    (value->val).m.data = __dest;
    memcpy(__dest,text,__size);
    (value->val).m.length = __size;
    return 1;
  }
LAB_00105795:
  iVar1 = __isoc99_sscanf(text,pcVar2,&value->val);
  if (iVar1 == 1) {
    return 1;
  }
LAB_001057e1:
  fprintf(_stderr,"%s:value_from_text: couldn\'t parse \'%c\' from  \"%s\"\n",argv0,
          (ulong)(uint)value->type,text);
  return 0;
}

Assistant:

int
value_from_text(
    const char* text,
    value_t* value,
    char type)
{
#define READ(f, x) \
    if (sscanf(text, "%" #f, &x) != 1) { \
        fprintf(stderr, "%s:value_from_text: couldn't parse '%c' from  \"%s\"\n", argv0, value->type, text); \
        return 0; \
    }

    unsigned int utmp;
    int stmp;

    value->type = type;

    switch (value->type) {
    case 'f':
        READ(f, value->val.f);
        break;
    case 'd':
        READ(lf, value->val.d);
        break;
    case 'b':
        READ(u, utmp);
        value->val.b = utmp;
        break;
    case 'c':
        READ(d, stmp);
        value->val.c = stmp;
        break;
    case 'u':
        READ(u, utmp);
        value->val.u = utmp;
        break;
    case 's':
        READ(d, stmp);
        value->val.s = stmp;
        break;
    case 'U':
        READ(u, value->val.U);
        break;
    case 'S':
        READ(d, value->val.S);
        break;
    case 'C':
        if (sscanf(text, "#%02hhx%02hhx%02hhx%02hhx", &value->val.C[0], &value->val.C[1], &value->val.C[2], &value->val.C[3]) != 4) {
            fprintf(stderr, "%s:value_from_text: couldn't parse '%c' from  \"%s\"\n", argv0, value->type, text);
            return 0;
        }
        break;
    case 'z':
        value->val.z = strdup(text);
        break;
    case 'm': {
        size_t zlen = strlen(text);
        value->val.m.data = malloc(zlen);
        memcpy(value->val.m.data, text, zlen);
        value->val.m.length = zlen;
        break;
    }
    default:
        fprintf(stderr, "%s:value_from_text: invalid type '%c'\n", argv0, value->type);
        return 0;
    }

    return 1;

#undef READ
}